

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

void CVmObjGramProd::process_work_queue_head
               (CVmGramProdMem *mem,vmgramprod_tok *tok,size_t tok_cnt,CVmGramProdQueue *queues,
               CVmObjDict *dict)

{
  vm_obj_id_t vVar1;
  int iVar2;
  CVmGramProdMatch *pCVar3;
  CVmGramProdMatchEntry *pCVar4;
  CVmGramProdQueue *in_RCX;
  vmgramprod_tok *tok_00;
  ulong in_RDX;
  size_t unaff_RBX;
  CVmGramProdState *in_RSI;
  size_t in_RDI;
  vmgramprod_tok *unaff_retaddr;
  CVmGramProdMem *in_stack_00000008;
  CVmObjGramProd *in_stack_00000010;
  CVmGramProdQueue *in_stack_00000020;
  vm_obj_id_t in_stack_00000028;
  int in_stack_00000030;
  CVmGramProdMatchEntry *entry;
  CVmObjGramProd *prod_objp;
  vm_obj_id_t prod_obj_id;
  vm_prop_id_t *prop;
  size_t rem;
  CVmObjGramProd *sub_objp;
  vm_obj_id_t sub_obj_id;
  vm_val_t match_result;
  int match_1;
  vm_prop_id_t enclosing_target_prop;
  int tok_matched_star;
  vmgram_tok_info *tokp;
  CVmGramProdMatch *match;
  CVmGramProdState *state;
  undefined4 uVar5;
  size_t siz;
  undefined2 in_stack_ffffffffffffff38;
  vm_prop_id_t in_stack_ffffffffffffff3a;
  int in_stack_ffffffffffffff3c;
  vm_val_t *in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  undefined2 in_stack_ffffffffffffff50;
  undefined2 in_stack_ffffffffffffff52;
  undefined1 in_stack_ffffffffffffff54;
  undefined1 in_stack_ffffffffffffff55;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  CVmGramProdMatch **in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  vm_prop_id_t *local_88;
  size_t local_80;
  vm_val_t local_68;
  uint local_54;
  vm_prop_id_t local_4e;
  undefined4 local_4c;
  vmgram_tok_info *local_48;
  CVmGramProdMatch *local_40;
  CVmGramProdState *local_38;
  CVmGramProdQueue *local_28;
  ulong local_20;
  
  local_38 = in_RCX->work_queue_;
  in_RCX->work_queue_ = local_38->nxt_;
  local_38->nxt_ = (CVmGramProdState *)0x0;
  local_48 = local_38->altp_->toks + local_38->alt_pos_;
  local_4c = 0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  do {
    if (local_38->altp_->tok_cnt <= local_38->alt_pos_) {
      if (local_38->enclosing_ == (CVmGramProdState *)0x0) {
        local_4e = 0;
      }
      else {
        local_4e = local_38->enclosing_->sub_target_prop_;
      }
      siz = local_38->altp_->tok_cnt;
      local_40 = CVmGramProdMatch::alloc
                           ((CVmGramProdMem *)
                            CONCAT17(in_stack_ffffffffffffff57,
                                     CONCAT16(in_stack_ffffffffffffff56,
                                              CONCAT15(in_stack_ffffffffffffff55,
                                                       CONCAT14(in_stack_ffffffffffffff54,
                                                                CONCAT22(local_4e,
                                                  in_stack_ffffffffffffff50))))),
                            in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                            in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3a,
                            (vm_obj_id_t)(siz >> 0x20),in_stack_ffffffffffffff60,
                            in_stack_ffffffffffffff68);
      if (local_38->circular_alt_ != 0) {
        iVar2 = is_gramprod_obj(0);
        uVar5 = (undefined4)(siz >> 0x20);
        if (iVar2 == 0) {
          err_throw(0);
        }
        vVar1 = local_38->prod_obj_;
        vm_objp(0);
        siz = CONCAT44(uVar5,vVar1);
        in_stack_ffffffffffffff38 = 1;
        in_stack_ffffffffffffff3a = 0;
        enqueue_alts(in_stack_00000010,in_stack_00000008,unaff_retaddr,unaff_RBX,in_RDI,in_RSI,
                     in_stack_00000020,in_stack_00000028,in_stack_00000030,(CVmGramProdMatch *)entry
                     ,(CVmObjDict *)prod_objp);
      }
      if (local_38->enclosing_ == (CVmGramProdState *)0x0) {
        if ((local_20 <= local_38->tok_pos_) || (local_38->matched_star_ != 0)) {
          pCVar4 = (CVmGramProdMatchEntry *)
                   CVmGramProdMem::alloc
                             ((CVmGramProdMem *)
                              CONCAT44(in_stack_ffffffffffffff3c,
                                       CONCAT22(in_stack_ffffffffffffff3a,in_stack_ffffffffffffff38)
                                      ),siz);
          pCVar4->match_ = local_40;
          pCVar4->tok_pos_ = local_38->tok_pos_;
          pCVar4->nxt_ = local_28->success_list_;
          local_28->success_list_ = pCVar4;
        }
      }
      else {
        local_38->enclosing_->match_list_[local_38->enclosing_->alt_pos_] = local_40;
        local_38->enclosing_->alt_pos_ = local_38->enclosing_->alt_pos_ + 1;
        local_38->enclosing_->tok_pos_ = local_38->tok_pos_;
        local_38->enclosing_->matched_star_ = local_38->matched_star_;
        enqueue_state(local_38->enclosing_,local_28);
      }
      return;
    }
    vm_val_t::set_nil(&local_68);
    tok_00 = (vmgramprod_tok *)(ulong)(local_48->typ - 1);
    switch(tok_00) {
    case (vmgramprod_tok *)0x0:
      iVar2 = is_gramprod_obj(0);
      if (iVar2 != 0) {
        vm_objp(0);
        local_38->sub_target_prop_ = local_48->prop;
        enqueue_alts(in_stack_00000010,in_stack_00000008,unaff_retaddr,unaff_RBX,in_RDI,in_RSI,
                     in_stack_00000020,in_stack_00000028,in_stack_00000030,(CVmGramProdMatch *)entry
                     ,(CVmObjDict *)prod_objp);
        return;
      }
      err_throw(0);
    case (vmgramprod_tok *)0x1:
      in_stack_ffffffffffffff57 = false;
      if (local_38->tok_pos_ < local_20) {
        iVar2 = find_prop_in_tok((vmgramprod_tok *)
                                 (in_RSI->match_list_ + local_38->tok_pos_ * 8 + -8),
                                 (local_48->typinfo).speech_prop);
        in_stack_ffffffffffffff57 = iVar2 != 0;
      }
      local_54 = (uint)(byte)in_stack_ffffffffffffff57;
      break;
    case (vmgramprod_tok *)0x2:
      in_stack_ffffffffffffff56 = false;
      if ((local_38->tok_pos_ < local_20) &&
         (in_stack_ffffffffffffff56 = false,
         (local_48->typinfo).lit.hash ==
         *(uint *)(in_RSI->match_list_ + local_38->tok_pos_ * 8 + -3))) {
        iVar2 = tok_equals_lit(tok_00,(char *)CONCAT17(in_stack_ffffffffffffff57,
                                                       (uint7)CONCAT15(in_stack_ffffffffffffff55,
                                                                       CONCAT14(
                                                  in_stack_ffffffffffffff54,
                                                  CONCAT22(in_stack_ffffffffffffff52,
                                                           in_stack_ffffffffffffff50)))),
                               in_stack_ffffffffffffff48,(CVmObjDict *)in_stack_ffffffffffffff40,
                               (vm_val_t *)
                               CONCAT44(in_stack_ffffffffffffff3c,
                                        CONCAT22(in_stack_ffffffffffffff3a,in_stack_ffffffffffffff38
                                                )));
        in_stack_ffffffffffffff56 = iVar2 != 0;
      }
      local_54 = (uint)(byte)in_stack_ffffffffffffff56;
      break;
    case (vmgramprod_tok *)0x3:
      in_stack_ffffffffffffff55 = false;
      if (local_38->tok_pos_ < local_20) {
        in_stack_ffffffffffffff55 =
             in_RSI->match_list_[local_38->tok_pos_ * 8 + -6] ==
             (CVmGramProdMatch *)(ulong)(local_48->typinfo).prod_obj;
      }
      local_54 = (uint)(byte)in_stack_ffffffffffffff55;
      break;
    case (vmgramprod_tok *)0x4:
      local_54 = 1;
      local_38->matched_star_ = 1;
      local_4c = 1;
      break;
    case (vmgramprod_tok *)0x5:
      if (local_38->tok_pos_ < local_20) {
        local_54 = 0;
        local_88 = (local_48->typinfo).nspeech.props;
        for (local_80 = (local_48->typinfo).nspeech.cnt; local_80 != 0; local_80 = local_80 - 1) {
          iVar2 = find_prop_in_tok((vmgramprod_tok *)
                                   (in_RSI->match_list_ + local_38->tok_pos_ * 8 + -8),*local_88);
          if (iVar2 != 0) {
            local_54 = 1;
            break;
          }
          local_88 = local_88 + 1;
        }
      }
      else {
        local_54 = 0;
      }
    }
    if (local_54 == 0) {
      return;
    }
    pCVar3 = CVmGramProdMatch::alloc
                       ((CVmGramProdMem *)
                        CONCAT17(in_stack_ffffffffffffff57,
                                 CONCAT16(in_stack_ffffffffffffff56,
                                          CONCAT15(in_stack_ffffffffffffff55,
                                                   CONCAT14(in_stack_ffffffffffffff54,
                                                            CONCAT22(in_stack_ffffffffffffff52,
                                                                     in_stack_ffffffffffffff50))))),
                        in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                        in_stack_ffffffffffffff3c,in_stack_ffffffffffffff3a,0,
                        in_stack_ffffffffffffff60,in_stack_ffffffffffffff68);
    local_38->match_list_[local_38->alt_pos_] = pCVar3;
    local_38->alt_pos_ = local_38->alt_pos_ + 1;
    if (local_38->matched_star_ == 0) {
      local_38->tok_pos_ = local_38->tok_pos_ + 1;
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

void CVmObjGramProd::process_work_queue_head(VMG_ CVmGramProdMem *mem,
                                             const vmgramprod_tok *tok,
                                             size_t tok_cnt,
                                             CVmGramProdQueue *queues,
                                             CVmObjDict *dict)
{
    CVmGramProdState *state;
    CVmGramProdMatch *match;
    const vmgram_tok_info *tokp;
    int tok_matched_star;
    vm_prop_id_t enclosing_target_prop;
    
    /* get the first entry from the queue */
    state = queues->work_queue_;

    /* unlink this entry from the queue */
    queues->work_queue_ = state->nxt_;
    state->nxt_ = 0;

    /* get the token pointer for the next active entry in the alternative */
    tokp = state->altp_->toks + state->alt_pos_;

    /* presume we won't match a '*' token */
    tok_matched_star = FALSE;

    /* process the remaining items in the entry */
    while (state->alt_pos_ < state->altp_->tok_cnt)
    {
        int match;
        vm_val_t match_result;

        /* presume we won't find a match */
        match_result.set_nil();

        /* see what we have for this token */
        switch(tokp->typ)
        {
        case VMGRAM_MATCH_PROD:
            {
                vm_obj_id_t sub_obj_id;
                CVmObjGramProd *sub_objp;

                /*
                 *   This is a sub-production node.  Get the
                 *   sub-production object.  
                 */
                sub_obj_id = tokp->typinfo.prod_obj;

                /* make sure it's of the correct metaclass */
                if (!CVmObjGramProd::is_gramprod_obj(vmg_ sub_obj_id))
                {
                    /* wrong type - throw an error */
                    err_throw(VMERR_INVAL_OBJ_TYPE);
                }

                /* get the sub-production object */
                sub_objp = (CVmObjGramProd *)vm_objp(vmg_ sub_obj_id);

                /* 
                 *   set my subproduction target property, so that the
                 *   sub-production can set the target property correctly 
                 */
                state->sub_target_prop_ = tokp->prop;
                
                /* enqueue the alternatives for the sub-production */
                sub_objp->enqueue_alts(vmg_ mem, tok, tok_cnt,
                                       state->tok_pos_, state, queues,
                                       sub_obj_id, FALSE, 0, dict);
            }

            /* 
             *   Do not process the current state any further for now -
             *   we'll get back to it when (and if) we finish processing
             *   the sub-production.  Note that we don't even put the
             *   current state back in the queue - it's stacked behind the
             *   sub-production, and will be re-enqueued when we
             *   successfully finish with the sub-production.  
             */
            return;
            
        case VMGRAM_MATCH_SPEECH:
            /* part of speech - check to see if the current token matches */
            match = (state->tok_pos_ < tok_cnt
                     && find_prop_in_tok(&tok[state->tok_pos_],
                                         tokp->typinfo.speech_prop));
            break;

        case VMGRAM_MATCH_NSPEECH:
            /* 
             *   multiple parts of speech - check to see if the current token
             *   matches any of the parts of the speech 
             */
            if (state->tok_pos_ < tok_cnt)
            {
                size_t rem;
                const vm_prop_id_t *prop;

                /* presume we won't find a match */
                match = FALSE;

                /* check each item in the list */
                for (prop = tokp->typinfo.nspeech.props,
                     rem = tokp->typinfo.nspeech.cnt ;
                     rem != 0 ; --rem, ++prop)
                {
                    /* if this one matches, we have a match */
                    if (find_prop_in_tok(&tok[state->tok_pos_], *prop))
                    {
                        /* note the match */
                        match = TRUE;

                        /* no need to look any further at this token */
                        break;
                    }
                }
            }
            else
            {
                /* 
                 *   we're out of tokens, so we definitely don't have a
                 *   match, since we must match at least one of the possible
                 *   parts of speech of this item 
                 */
                match = FALSE;
            }
            break;
            
        case VMGRAM_MATCH_LITERAL:
            /* 
             *   Literal - check for a match to the string.  Test the hash
             *   values first, as this is much faster than comparing the
             *   strings, and at least tells us if the strings fail to match
             *   (and failing to match being by far the most common case,
             *   this saves us doing a full comparison most of the time).  
             */
            match = (state->tok_pos_ < tok_cnt
                     && tokp->typinfo.lit.hash == tok[state->tok_pos_].hash_
                     && tok_equals_lit(vmg_ &tok[state->tok_pos_],
                                       tokp->typinfo.lit.str,
                                       tokp->typinfo.lit.len,
                                       dict, &match_result));
            break;
            
        case VMGRAM_MATCH_TOKTYPE:
            /* token type */
            match = (state->tok_pos_ < tok_cnt
                     && (tok[state->tok_pos_].typ_
                         == tokp->typinfo.toktyp_enum));
            break;

        case VMGRAM_MATCH_STAR:
            /* 
             *   this matches anything remaining (it also matches if
             *   there's nothing remaining) 
             */
            match = TRUE;

            /* note that we matched a star in the state */
            state->matched_star_ = TRUE;

            /* note that we matched a star for this particular token */
            tok_matched_star = TRUE;
            break;
        }

        /* check for a match */
        if (match)
        {
            /* 
             *   we matched this token - add a token match to our state's
             *   match list for the current position 
             */
            state->match_list_[state->alt_pos_] =
                CVmGramProdMatch::alloc(mem, state->tok_pos_, &match_result,
                                        tok_matched_star, tokp->prop,
                                        VM_INVALID_OBJ, 0, 0);

            /* we're done with this alternative item - move on */
            state->alt_pos_++;

            /* 
             *   If we matched a real token, consume the matched input
             *   token.  For a '*', we don't want to consume anything, since
             *   a '*' merely stops parsing and doesn't actually match
             *   anything.  
             */
            if (!state->matched_star_)
                state->tok_pos_++;
            
            /* move on to the next alternative token item */
            ++tokp;
        }
        else
        {
            /* 
             *   This is not a match - reject this alternative.  We do not
             *   need to process this item further, so we can stop now,
             *   without returning this state to the work queue.  Simply
             *   abandon this work queue item.  
             */
            return;
        }
    }

    /* 
     *   If we make it here, we've reached the end of this alternative and
     *   have matched everything in it.  This means that the alternative
     *   was successful, so we can perform a 'reduce' operation to replace
     *   the matched tokens with this production.  
     */

    /* if we have an enclosing state, get its target property */
    enclosing_target_prop = (state->enclosing_ != 0
                             ? state->enclosing_->sub_target_prop_
                             : VM_INVALID_PROP);

    /* create a match for the entire alternative (i.e., the subproduction) */
    match = CVmGramProdMatch::alloc(
        mem, state->tok_pos_, 0, FALSE, enclosing_target_prop,
        state->altp_->proc_obj, &state->match_list_[0],
        state->altp_->tok_cnt);

    /*
     *   If the state we just matched was marked on creation as coming
     *   from an alternative with circular alternatives, we've just come
     *   up with a match for each circular alternative.  To avoid infinite
     *   recursion, we never enqueue the circular alternatives; however,
     *   now that we know we have a match for the first element of each
     *   circular alternative, we can check each of them to see if we can
     *   enqueue them.
     */
    if (state->circular_alt_)
    {
        vm_obj_id_t prod_obj_id;
        CVmObjGramProd *prod_objp;

        /* 
         *   Get the production from which this alternative came (there
         *   should be no need to check the metaclass, since we could only
         *   have created the state object from a valid production in the
         *   first place).
         *   
         *   First, make sure it's of the correct class.  (It almost
         *   certainly is, since the compiler should have generated this
         *   reference automatically, so there should be no possibility of a
         *   user error.  However, if it's not a production object, we'll
         *   probably crash by blindly casting it to one; so we'll check
         *   here, just to be sure that the compiler didn't do something
         *   wrong and the image file didn't become corrupted.)  
         */
        if (!CVmObjGramProd::is_gramprod_obj(vmg_ state->prod_obj_))
        {
            /* wrong type - throw an error */
            err_throw(VMERR_INVAL_OBJ_TYPE);
        }

        /* get the object, properly cast */
        prod_obj_id = state->prod_obj_;
        prod_objp = (CVmObjGramProd *)vm_objp(vmg_ prod_obj_id);

        /* 
         *   Enqueue the matching circular alternatives from the original
         *   production.  Our match becomes the first token match in the
         *   circular alternative (i.e., it matches the leading circular
         *   reference element).  
         */
        prod_objp->enqueue_alts(vmg_ mem, tok, tok_cnt, state->tok_pos_,
                                state->enclosing_, queues, prod_obj_id,
                                TRUE, match, dict);
    }

    /* check for an enclosing state to pop */
    if (state->enclosing_ != 0)
    {
        /* add the match to the enclosing state's match list */
        state->enclosing_->match_list_[state->enclosing_->alt_pos_] = match;
        state->enclosing_->alt_pos_++;

        /* 
         *   Move the enclosing state's token position to our token position
         *   - since it now encompasses our match, it has consumed all of
         *   the tokens therein.  Likewise, set the '*' flag in the parent
         *   to our own setting.  
         */
        state->enclosing_->tok_pos_ = state->tok_pos_;
        state->enclosing_->matched_star_ = state->matched_star_;

        /* enqueue the enclosing state so we can continue parsing it */
        enqueue_state(state->enclosing_, queues);
    }
    else
    {
        CVmGramProdMatchEntry *entry;
        
        /* 
         *   This is a top-level state, so we've completed parsing.  If
         *   we've consumed all input, or we matched a '*' token, we were
         *   successful.  If there's more input remaining, this is not a
         *   match.  
         */
        if (state->tok_pos_ < tok_cnt && !state->matched_star_)
        {
            /*
             *   There's more input remaining, so this isn't a match.
             *   Reject this alternative.  We do not need to process this
             *   item further, so stop now without returning this state
             *   object to the work queue. 
             */

            /* abandon this work queue item */
            return;
        }

        /* create a new entry for the match list */
        entry = (CVmGramProdMatchEntry *)mem->alloc(sizeof(*entry));
        entry->match_ = match;
        entry->tok_pos_ = state->tok_pos_;

        /* link the entry into the list */
        entry->nxt_ = queues->success_list_;
        queues->success_list_ = entry;
    }
}